

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_frame_buffer_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_79f906::ExternalFrameBufferList::SetFrameBuffer
          (ExternalFrameBufferList *this,int idx,aom_codec_frame_buffer_t *fb)

{
  bool bVar1;
  Message *in_RDX;
  int in_ESI;
  aom_codec_frame_buffer **in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar2;
  Type in_stack_ffffffffffffff9c;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffa0;
  AssertionResult local_28;
  undefined4 in_stack_fffffffffffffff0;
  
  testing::internal::CmpHelperNE<aom_codec_frame_buffer*,decltype(nullptr)>
            ((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80,in_RDI,&in_stack_ffffffffffffff70->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0._M_head_impl);
    in_stack_ffffffffffffff70 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x712784);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffffa0._M_head_impl,in_stack_ffffffffffffff9c,
               (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff70);
    testing::Message::~Message((Message *)0x7127d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x712838);
  if (bVar1) {
    (in_RDX->ss_)._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         in_RDI[2][in_ESI].data;
    in_RDX[1].ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         in_RDI[2][in_ESI].size;
    uVar2 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               in_stack_ffffffffffffff80,(int *)in_RDI,(int *)in_stack_ffffffffffffff70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff98);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffffa0._M_head_impl);
      testing::AssertionResult::failure_message((AssertionResult *)0x712906);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffffffa0._M_head_impl,in_stack_ffffffffffffff9c,
                 (char *)CONCAT44(uVar2,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,
                 in_stack_ffffffffffffff80);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff70);
      testing::Message::~Message((Message *)0x712952);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x7129b5);
    if (bVar1) {
      *(undefined4 *)&in_RDI[2][in_ESI].priv = 1;
      in_RDX[2].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (in_RDI[2] + in_ESI);
    }
  }
  return;
}

Assistant:

void SetFrameBuffer(int idx, aom_codec_frame_buffer_t *fb) {
    ASSERT_NE(fb, nullptr);
    fb->data = ext_fb_list_[idx].data;
    fb->size = ext_fb_list_[idx].size;
    ASSERT_EQ(0, ext_fb_list_[idx].in_use);
    ext_fb_list_[idx].in_use = 1;
    fb->priv = &ext_fb_list_[idx];
  }